

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O0

string * __thiscall
absl::lts_20250127::StrCat<std::basic_string_view<char,std::char_traits<char>>,char[51]>
          (string *__return_storage_ptr__,lts_20250127 *this,AlphaNum *a,AlphaNum *b,AlphaNum *c,
          AlphaNum *d,AlphaNum *e,basic_string_view<char,_std::char_traits<char>_> *args,
          char (*args_1) [51])

{
  size_type sVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  AlphaNum local_128;
  size_type local_f8;
  char *local_f0;
  AlphaNum local_e8;
  string_view local_b8;
  string_view local_a8;
  string_view local_98;
  string_view local_88;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  string_view *local_48;
  undefined8 local_40;
  AlphaNum *local_38;
  AlphaNum *e_local;
  AlphaNum *d_local;
  AlphaNum *c_local;
  AlphaNum *b_local;
  AlphaNum *a_local;
  
  local_38 = d;
  e_local = c;
  d_local = b;
  c_local = a;
  b_local = (AlphaNum *)this;
  a_local = (AlphaNum *)__return_storage_ptr__;
  local_b8 = AlphaNum::Piece((AlphaNum *)this);
  local_a8 = AlphaNum::Piece(c_local);
  local_98 = AlphaNum::Piece(d_local);
  local_88 = AlphaNum::Piece(e_local);
  local_78 = AlphaNum::Piece(local_38);
  sVar1 = (e->piece_)._M_len;
  local_f0 = (e->piece_)._M_str;
  local_f8 = sVar1;
  AlphaNum::AlphaNum(&local_e8,e->piece_);
  local_68 = AlphaNum::Piece(&local_e8);
  AlphaNum::AlphaNum(&local_128,(Nullable<const_char_*>)args);
  local_58 = AlphaNum::Piece(&local_128);
  local_48 = &local_b8;
  local_40 = 7;
  pieces._M_len = sVar1;
  pieces._M_array = (iterator)0x7;
  strings_internal::CatPieces_abi_cxx11_(__return_storage_ptr__,(strings_internal *)local_48,pieces)
  ;
  return __return_storage_ptr__;
}

Assistant:

ABSL_MUST_USE_RESULT inline std::string StrCat(
    const AlphaNum& a, const AlphaNum& b, const AlphaNum& c, const AlphaNum& d,
    const AlphaNum& e, const AV&... args) {
  return strings_internal::CatPieces(
      {a.Piece(), b.Piece(), c.Piece(), d.Piece(), e.Piece(),
       static_cast<const AlphaNum&>(args).Piece()...});
}